

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

EdwardsCurve * ecc_edwards_curve(mp_int *p,mp_int *d,mp_int *a,mp_int *nonsquare_mod_p)

{
  EdwardsCurve *pEVar1;
  mp_int *pmVar2;
  MontyContext *mc;
  ModsqrtContext *pMVar3;
  
  pMVar3 = (ModsqrtContext *)0x0;
  pEVar1 = (EdwardsCurve *)safemalloc(1,0x28,0);
  pmVar2 = mp_copy(p);
  pEVar1->p = pmVar2;
  mc = monty_new(p);
  pEVar1->mc = mc;
  pmVar2 = monty_import(mc,d);
  pEVar1->d = pmVar2;
  pmVar2 = monty_import(pEVar1->mc,a);
  pEVar1->a = pmVar2;
  if (nonsquare_mod_p != (mp_int *)0x0) {
    pMVar3 = modsqrt_new(p,nonsquare_mod_p);
  }
  pEVar1->sc = pMVar3;
  return pEVar1;
}

Assistant:

EdwardsCurve *ecc_edwards_curve(mp_int *p, mp_int *d, mp_int *a,
                                mp_int *nonsquare_mod_p)
{
    EdwardsCurve *ec = snew(EdwardsCurve);
    ec->p = mp_copy(p);
    ec->mc = monty_new(p);
    ec->d = monty_import(ec->mc, d);
    ec->a = monty_import(ec->mc, a);

    if (nonsquare_mod_p)
        ec->sc = modsqrt_new(p, nonsquare_mod_p);
    else
        ec->sc = NULL;

    return ec;
}